

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test::
TestBody(MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test *this)

{
  bool bVar1;
  TestField *pTVar2;
  FieldDescriptor *field;
  char *pcVar3;
  char *in_R9;
  string local_4b0;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_448;
  Message local_440;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_;
  string local_418;
  undefined1 local_3f8 [8];
  MessageDifferencer differencer;
  TestDiffMessage c;
  undefined1 local_180 [8];
  TestDiffMessage b;
  TestDiffMessage a;
  MessageDifferencerTest_RepeatedFieldSetTest_PartialSimple_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&b.field_0 + 0xa0));
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::TestDiffMessage
            ((TestDiffMessage *)&differencer.unpack_any_field_);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&b.field_0 + 0xa0));
  proto2_unittest::TestField::set_c(pTVar2,1);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)((long)&b.field_0 + 0xa0));
  proto2_unittest::TestField::set_c(pTVar2,0);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestField::set_c(pTVar2,1);
  proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::add_rm((TestDiffMessage *)&differencer.unpack_any_field_);
  pTVar2 = proto2_unittest::TestDiffMessage::add_rm
                     ((TestDiffMessage *)&differencer.unpack_any_field_);
  proto2_unittest::TestField::set_c(pTVar2,1);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_3f8);
  util::MessageDifferencer::set_scope((MessageDifferencer *)local_3f8,PARTIAL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"rm",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  field = GetFieldDescriptor((Message *)((long)&b.field_0 + 0xa0),&local_418);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)local_3f8,field);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_431 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_3f8,(Message *)local_180,
                         (Message *)((long)&b.field_0 + 0xa0));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_430,&local_431,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_430,
               (AssertionResult *)"differencer.Compare(b, a)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x828,pcVar3);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_479 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_3f8,(Message *)&differencer.unpack_any_field_,
                         (Message *)((long)&b.field_0 + 0xa0));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4b0,(internal *)local_478,(AssertionResult *)"differencer.Compare(c, a)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x829,pcVar3);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&local_4b0);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_3f8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)&differencer.unpack_any_field_);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_180);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)((long)&b.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSetTest_PartialSimple) {
  proto2_unittest::TestDiffMessage a, b, c;
  // message a: {
  //   rm { c: 1 }
  //   rm { c: 0 }
  // }
  a.add_rm()->set_c(1);
  a.add_rm()->set_c(0);
  // message b: {
  //   rm { c: 1 }
  //   rm {}
  // }
  b.add_rm()->set_c(1);
  b.add_rm();
  // message c: {
  //   rm {}
  //   rm { c: 1 }
  // }
  c.add_rm();
  c.add_rm()->set_c(1);
  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.TreatAsSet(GetFieldDescriptor(a, "rm"));
  EXPECT_TRUE(differencer.Compare(b, a));
  EXPECT_TRUE(differencer.Compare(c, a));
}